

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool google::protobuf::safe_int_internal<int>(string *text,int *value_p)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *local_60;
  long local_58;
  byte local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  *value_p = 0;
  pcVar7 = (text->_M_dataplus)._M_p;
  pcVar1 = pcVar7 + text->_M_string_length;
  if (0 < (long)text->_M_string_length) {
    do {
      if (*pcVar7 != ' ') break;
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < pcVar1);
  }
  do {
    pcVar9 = pcVar1;
    if (pcVar9 <= pcVar7) goto LAB_002b63b1;
    pcVar1 = pcVar9 + -1;
  } while (pcVar9[-1] == ' ');
  cVar2 = *pcVar7;
  if (((cVar2 == '-') || (cVar2 == '+')) && (pcVar9 <= pcVar7 + 1)) {
LAB_002b63b1:
    bVar5 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)text);
    std::__cxx11::string::operator=((string *)text,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if (cVar2 == '-') {
      bVar5 = safe_parse_negative_int<int>(text,value_p);
    }
    else {
      pcVar4 = (text->_M_dataplus)._M_p;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar4,pcVar4 + text->_M_string_length);
      bVar5 = true;
      if (local_58 < 1) {
        iVar6 = 0;
      }
      else {
        iVar6 = 0;
        pbVar8 = local_60;
        do {
          bVar3 = *pbVar8;
          if ((byte)(bVar3 - 0x3a) < 0xf6) {
            bVar5 = false;
            break;
          }
          if (0xccccccc < iVar6) {
LAB_002b6431:
            bVar5 = false;
            iVar6 = 0x7fffffff;
            break;
          }
          if ((int)(-0x7fffffd1 - (uint)bVar3) < iVar6 * 10) goto LAB_002b6431;
          iVar6 = iVar6 * 10 + (uint)bVar3 + -0x30;
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 < local_60 + local_58);
      }
      *value_p = iVar6;
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
    }
  }
  return bVar5;
}

Assistant:

bool safe_int_internal(string text, IntType* value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative)) {
    return false;
  }
  if (!negative) {
    return safe_parse_positive_int(text, value_p);
  } else {
    return safe_parse_negative_int(text, value_p);
  }
}